

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O0

void __thiscall
lwlog::details::hour_clock_12_formatter::format
          (hour_clock_12_formatter *this,string *pattern,record_base *record)

{
  record_base *pattern_00;
  int iVar1;
  undefined4 extraout_var;
  uint32_t digit;
  uint32_t digit_00;
  uint32_t digit_01;
  char *local_150;
  string local_138;
  string local_118;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  time_point_base *time_point;
  record_base *record_local;
  string *pattern_local;
  hour_clock_12_formatter *this_local;
  
  time_point = (time_point_base *)record;
  record_local = (record_base *)pattern;
  pattern_local = (string *)this;
  iVar1 = (*record->_vptr_record_base[2])();
  pattern_00 = record_local;
  local_28 = CONCAT44(extraout_var,iVar1);
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_e8,(datetime *)(ulong)*(byte *)(local_28 + 0xd),digit);
  std::operator+(&local_c8,&local_e8,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_118,(datetime *)(ulong)*(byte *)(local_28 + 0xe),digit_00);
  std::operator+(&local_a8,&local_c8,&local_118);
  std::operator+(&local_88,&local_a8,'-');
  os::datetime::ensure_two_digit_format_abi_cxx11_
            (&local_138,(datetime *)(ulong)*(byte *)(local_28 + 0xf),digit_01);
  std::operator+(&local_68,&local_88,&local_138);
  if (*(byte *)(local_28 + 0xd) < 0xc) {
    local_150 = "am";
  }
  else {
    local_150 = "pm";
  }
  std::operator+(&local_48,&local_68,local_150);
  formatter::format_attribute<std::__cxx11::string>
            ((string *)pattern_00,(flag_pair *)flag::hour_clock_12,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::hour_clock_12,
				os::datetime::ensure_two_digit_format(time_point.hour)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.minute)
					+ '-' + os::datetime::ensure_two_digit_format(time_point.second) 
					+ (time_point.hour >= 12 ? "pm" : "am")
			);
		}